

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O0

char * __thiscall google::protobuf::FieldDescriptor::index(FieldDescriptor *this,char *__s,int __c)

{
  Descriptor *pDVar1;
  FieldDescriptor *this_local;
  
  if (((byte)this->field_0x1 >> 3 & 1) == 0) {
    pDVar1 = containing_type(this);
    this_local._4_4_ = (uint)(((long)this - (long)pDVar1->fields_) / 0x58);
  }
  else {
    pDVar1 = extension_scope(this);
    if (pDVar1 == (Descriptor *)0x0) {
      this_local._4_4_ = (uint)(((long)this - (long)this->file_->extensions_) / 0x58);
    }
    else {
      pDVar1 = extension_scope(this);
      this_local._4_4_ = (uint)(((long)this - (long)pDVar1->extensions_) / 0x58);
    }
  }
  return (char *)(ulong)this_local._4_4_;
}

Assistant:

inline int FieldDescriptor::index() const {
  if (!is_extension_) {
    return static_cast<int>(this - containing_type()->fields_);
  } else if (extension_scope() != nullptr) {
    return static_cast<int>(this - extension_scope()->extensions_);
  } else {
    return static_cast<int>(this - file_->extensions_);
  }
}